

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
matrix_sparse_element_test_inequality_comparison_Test::TestBody
          (matrix_sparse_element_test_inequality_comparison_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  element_type different_element;
  double different_value;
  undefined1 local_78 [4];
  int different_column;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  element_type same_element;
  matrix_sparse_element_test_inequality_comparison_Test *this_local;
  
  Disa::Matrix_Sparse_Element<double,_int>::Matrix_Sparse_Element
            ((Matrix_Sparse_Element<double,_int> *)&gtest_ar_.message_,
             &(this->super_matrix_sparse_element_test).column_index,
             &(this->super_matrix_sparse_element_test).value);
  local_31 = Disa::Matrix_Sparse_Element<double,_int>::operator!=
                       ((this->super_matrix_sparse_element_test).element,
                        (base_type *)&gtest_ar_.message_);
  local_31 = !local_31;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_30,(AssertionResult *)"*element != same_element"
               ,"true","false",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)local_78);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  different_value._4_4_ = 6;
  different_element.ptr_value = (pointer_value)0x4005ae147ae147ae;
  Disa::Matrix_Sparse_Element<double,_int>::Matrix_Sparse_Element
            ((Matrix_Sparse_Element<double,_int> *)&gtest_ar__1.message_,
             (const_pointer_index)((long)&different_value + 4),
             (pointer_value)&different_element.ptr_value);
  local_a9 = Disa::Matrix_Sparse_Element<double,_int>::operator!=
                       ((this->super_matrix_sparse_element_test).element,
                        (base_type *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_a8,(AssertionResult *)"*element != different_element",
               "false","true",in_R9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST_F(matrix_sparse_element_test, inequality_comparison) {
  element_type same_element(&column_index, &value);
  EXPECT_FALSE(*element != same_element);

  int different_column = 6;
  double different_value = 2.71;
  element_type different_element(&different_column, &different_value);
  EXPECT_TRUE(*element != different_element);
}